

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::setOptionValue(Highs *this,string *option,double value)

{
  OptionStatus OVar1;
  HighsStatus HVar2;
  double in_RDI;
  string *unaff_retaddr;
  Highs *in_stack_00000078;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  OVar1 = setLocalOptionValue((HighsLogOptions *)value,unaff_retaddr,
                              (vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  if (OVar1 == kOk) {
    HVar2 = optionChangeAction(in_stack_00000078);
  }
  else {
    HVar2 = kError;
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::setOptionValue(const std::string& option,
                                  const double value) {
  if (setLocalOptionValue(options_.log_options, option, options_.records,
                          value) == OptionStatus::kOk)
    return optionChangeAction();
  return HighsStatus::kError;
}